

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remove_Entity_R_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Remove_Entity_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Remove_Entity_R_PDU *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Remove Entity-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1e0,(Simulation_Management_Header *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  Reliability_Header::GetAsString_abi_cxx11_
            (&local_200,&(this->super_Create_Entity_R_PDU).super_Reliability_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"Request ID: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Remove_Entity_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Remove Entity-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << Reliability_Header::GetAsString()
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}